

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void idct16x16_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar13;
  int iVar14;
  undefined1 auVar12 [16];
  int iVar15;
  int iVar17;
  int iVar18;
  undefined1 auVar16 [16];
  int iVar19;
  int iVar20;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  undefined1 auVar21 [16];
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar34 [16];
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  uint uVar48;
  int iVar51;
  uint uVar52;
  int iVar53;
  uint uVar54;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  int iVar55;
  uint uVar56;
  undefined1 auVar57 [16];
  int iVar58;
  int iVar62;
  int iVar63;
  undefined1 auVar59 [16];
  int iVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  int iVar65;
  int iVar74;
  int iVar76;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  uint uVar66;
  uint uVar75;
  uint uVar77;
  int iVar78;
  uint uVar79;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar80;
  uint uVar81;
  int iVar85;
  uint uVar86;
  int iVar87;
  uint uVar88;
  undefined1 auVar82 [16];
  int iVar89;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar90;
  int iVar91;
  int iVar96;
  int iVar97;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  int iVar98;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  int iVar99;
  int iVar100;
  int iVar103;
  int iVar104;
  int iVar105;
  int iVar106;
  undefined1 auVar101 [16];
  int iVar107;
  undefined1 auVar102 [16];
  int iVar108;
  int iVar109;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  int iVar116;
  int iVar117;
  undefined1 auVar114 [16];
  int iVar118;
  undefined1 auVar115 [16];
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  lVar5 = (long)bit;
  auVar21 = ZEXT416((uint)bit);
  lVar6 = lVar5 * 0x100;
  iVar10 = -*(int *)(&DAT_00d47520 + lVar6);
  iVar47 = *(int *)(&DAT_00d474c0 + lVar5 * 0x20);
  iVar11 = *(int *)(&DAT_00d47540 + lVar6);
  iVar8 = -iVar47;
  iVar7 = -iVar11;
  iVar13 = -*(int *)(&DAT_00d47510 + lVar6);
  iVar9 = 1 << ((char)bit - 1U & 0x1f);
  iVar14 = -*(int *)(&DAT_00d47550 + lVar6);
  iVar2 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar4 = 0x8000;
  if (0xf < iVar2) {
    iVar4 = 1 << ((char)iVar2 - 1U & 0x1f);
  }
  uVar1 = *(undefined4 *)(&DAT_00d47570 + lVar6);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_00d474f0 + lVar6);
  auVar92._4_4_ = uVar1;
  auVar92._0_4_ = uVar1;
  auVar92._8_4_ = uVar1;
  auVar92._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_00d47530 + lVar6);
  auVar84._4_4_ = uVar1;
  auVar84._0_4_ = uVar1;
  auVar84._8_4_ = uVar1;
  auVar84._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_00d474d0 + lVar5 * 0x20);
  auVar12._4_4_ = uVar1;
  auVar12._0_4_ = uVar1;
  auVar12._8_4_ = uVar1;
  auVar12._12_4_ = uVar1;
  iVar2 = LoadMaskz2[lVar5 * 8 + 7][4];
  auVar59._4_4_ = iVar2;
  auVar59._0_4_ = iVar2;
  auVar59._8_4_ = iVar2;
  auVar59._12_4_ = iVar2;
  iVar2 = LoadMaskz2[lVar5 * 8 + 6][4];
  auVar68._4_4_ = iVar2;
  auVar68._0_4_ = iVar2;
  auVar68._8_4_ = iVar2;
  auVar68._12_4_ = iVar2;
  uVar1 = *(undefined4 *)(&DAT_00d47560 + lVar6);
  auVar101._4_4_ = uVar1;
  auVar101._0_4_ = uVar1;
  auVar101._8_4_ = uVar1;
  auVar101._12_4_ = uVar1;
  uVar1 = *(undefined4 *)(&DAT_00d474e0 + lVar5 * 0x20);
  auVar70._4_4_ = uVar1;
  auVar70._0_4_ = uVar1;
  auVar70._8_4_ = uVar1;
  auVar70._12_4_ = uVar1;
  auVar72._4_4_ = iVar10;
  auVar72._0_4_ = iVar10;
  auVar72._8_4_ = iVar10;
  auVar72._12_4_ = iVar10;
  iVar10 = LoadMaskz2[lVar5 * 8 + 7][0];
  auVar114._4_4_ = iVar10;
  auVar114._0_4_ = iVar10;
  auVar114._8_4_ = iVar10;
  auVar114._12_4_ = iVar10;
  auVar49._4_4_ = iVar13;
  auVar49._0_4_ = iVar13;
  auVar49._8_4_ = iVar13;
  auVar49._12_4_ = iVar13;
  auVar82._4_4_ = iVar14;
  auVar82._0_4_ = iVar14;
  auVar82._8_4_ = iVar14;
  auVar82._12_4_ = iVar14;
  auVar16 = pmulld(auVar68,(undefined1  [16])in[1]);
  auVar68 = pmulld(auVar67,(undefined1  [16])in[1]);
  auVar50 = pmulld(auVar49,(undefined1  [16])in[7]);
  auVar93 = pmulld(auVar92,(undefined1  [16])in[7]);
  iVar15 = auVar16._0_4_ + iVar9 >> auVar21;
  iVar17 = auVar16._4_4_ + iVar9 >> auVar21;
  iVar18 = auVar16._8_4_ + iVar9 >> auVar21;
  iVar19 = auVar16._12_4_ + iVar9 >> auVar21;
  iVar65 = auVar68._0_4_ + iVar9 >> auVar21;
  iVar74 = auVar68._4_4_ + iVar9 >> auVar21;
  iVar76 = auVar68._8_4_ + iVar9 >> auVar21;
  iVar78 = auVar68._12_4_ + iVar9 >> auVar21;
  iVar46 = auVar50._0_4_ + iVar9 >> auVar21;
  iVar51 = auVar50._4_4_ + iVar9 >> auVar21;
  iVar53 = auVar50._8_4_ + iVar9 >> auVar21;
  iVar55 = auVar50._12_4_ + iVar9 >> auVar21;
  auVar16 = pmulld(auVar12,(undefined1  [16])in[5]);
  auVar50 = pmulld(auVar84,(undefined1  [16])in[5]);
  iVar91 = auVar93._0_4_ + iVar9 >> auVar21;
  iVar96 = auVar93._4_4_ + iVar9 >> auVar21;
  iVar97 = auVar93._8_4_ + iVar9 >> auVar21;
  iVar98 = auVar93._12_4_ + iVar9 >> auVar21;
  iVar10 = auVar16._0_4_ + iVar9 >> auVar21;
  iVar13 = auVar16._4_4_ + iVar9 >> auVar21;
  iVar14 = auVar16._8_4_ + iVar9 >> auVar21;
  iVar2 = auVar16._12_4_ + iVar9 >> auVar21;
  iVar38 = auVar50._0_4_ + iVar9 >> auVar21;
  iVar40 = auVar50._4_4_ + iVar9 >> auVar21;
  iVar42 = auVar50._8_4_ + iVar9 >> auVar21;
  iVar44 = auVar50._12_4_ + iVar9 >> auVar21;
  auVar50 = pmulld(auVar82,(undefined1  [16])in[3]);
  auVar16 = pmulld(auVar59,(undefined1  [16])in[3]);
  iVar80 = auVar50._0_4_ + iVar9 >> auVar21;
  iVar85 = auVar50._4_4_ + iVar9 >> auVar21;
  iVar87 = auVar50._8_4_ + iVar9 >> auVar21;
  iVar89 = auVar50._12_4_ + iVar9 >> auVar21;
  iVar58 = auVar16._0_4_ + iVar9 >> auVar21;
  iVar62 = auVar16._4_4_ + iVar9 >> auVar21;
  iVar63 = auVar16._8_4_ + iVar9 >> auVar21;
  iVar64 = auVar16._12_4_ + iVar9 >> auVar21;
  auVar16 = pmulld(auVar114,(undefined1  [16])in[2]);
  iVar113 = auVar16._0_4_ + iVar9 >> auVar21;
  iVar116 = auVar16._4_4_ + iVar9 >> auVar21;
  iVar117 = auVar16._8_4_ + iVar9 >> auVar21;
  iVar118 = auVar16._12_4_ + iVar9 >> auVar21;
  auVar16 = pmulld(auVar101,(undefined1  [16])in[2]);
  iVar99 = auVar16._0_4_ + iVar9 >> auVar21;
  iVar103 = auVar16._4_4_ + iVar9 >> auVar21;
  iVar105 = auVar16._8_4_ + iVar9 >> auVar21;
  iVar107 = auVar16._12_4_ + iVar9 >> auVar21;
  auVar16 = pmulld(auVar72,(undefined1  [16])in[6]);
  iVar33 = auVar16._0_4_ + iVar9 >> auVar21;
  iVar35 = auVar16._4_4_ + iVar9 >> auVar21;
  iVar36 = auVar16._8_4_ + iVar9 >> auVar21;
  iVar37 = auVar16._12_4_ + iVar9 >> auVar21;
  auVar16 = pmulld(auVar70,(undefined1  [16])in[6]);
  iVar29 = auVar16._0_4_ + iVar9 >> auVar21;
  iVar30 = auVar16._4_4_ + iVar9 >> auVar21;
  iVar31 = auVar16._8_4_ + iVar9 >> auVar21;
  iVar32 = auVar16._12_4_ + iVar9 >> auVar21;
  iVar20 = iVar46 + iVar65;
  iVar22 = iVar51 + iVar74;
  iVar23 = iVar53 + iVar76;
  iVar26 = iVar55 + iVar78;
  iVar65 = iVar65 - iVar46;
  iVar74 = iVar74 - iVar51;
  iVar76 = iVar76 - iVar53;
  iVar78 = iVar78 - iVar55;
  iVar46 = iVar80 + iVar38;
  iVar53 = iVar85 + iVar40;
  iVar24 = iVar87 + iVar42;
  iVar27 = iVar89 + iVar44;
  iVar80 = iVar80 - iVar38;
  iVar85 = iVar85 - iVar40;
  iVar87 = iVar87 - iVar42;
  iVar89 = iVar89 - iVar44;
  iVar51 = iVar58 + iVar10;
  iVar55 = iVar62 + iVar13;
  iVar25 = iVar63 + iVar14;
  iVar28 = iVar64 + iVar2;
  iVar58 = iVar58 - iVar10;
  iVar62 = iVar62 - iVar13;
  iVar63 = iVar63 - iVar14;
  iVar64 = iVar64 - iVar2;
  iVar39 = iVar91 + iVar15;
  iVar41 = iVar96 + iVar17;
  iVar43 = iVar97 + iVar18;
  iVar45 = iVar98 + iVar19;
  iVar15 = iVar15 - iVar91;
  iVar17 = iVar17 - iVar96;
  iVar18 = iVar18 - iVar97;
  iVar19 = iVar19 - iVar98;
  iVar38 = iVar33 + iVar99;
  iVar40 = iVar35 + iVar103;
  iVar42 = iVar36 + iVar105;
  iVar44 = iVar37 + iVar107;
  iVar99 = iVar99 - iVar33;
  iVar103 = iVar103 - iVar35;
  iVar105 = iVar105 - iVar36;
  iVar107 = iVar107 - iVar37;
  iVar13 = iVar29 + iVar113;
  iVar14 = iVar30 + iVar116;
  iVar33 = iVar31 + iVar117;
  iVar35 = iVar32 + iVar118;
  iVar113 = iVar113 - iVar29;
  iVar116 = iVar116 - iVar30;
  iVar117 = iVar117 - iVar31;
  iVar118 = iVar118 - iVar32;
  iVar10 = -iVar4;
  iVar4 = iVar4 + -1;
  auVar57._4_4_ = iVar11;
  auVar57._0_4_ = iVar11;
  auVar57._8_4_ = iVar11;
  auVar57._12_4_ = iVar11;
  auVar16._4_4_ = iVar8;
  auVar16._0_4_ = iVar8;
  auVar16._8_4_ = iVar8;
  auVar16._12_4_ = iVar8;
  uVar66 = (uint)(iVar65 < iVar10) * iVar10 | (uint)(iVar65 >= iVar10) * iVar65;
  uVar75 = (uint)(iVar74 < iVar10) * iVar10 | (uint)(iVar74 >= iVar10) * iVar74;
  uVar77 = (uint)(iVar76 < iVar10) * iVar10 | (uint)(iVar76 >= iVar10) * iVar76;
  uVar79 = (uint)(iVar78 < iVar10) * iVar10 | (uint)(iVar78 >= iVar10) * iVar78;
  auVar69._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar69._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar69._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar69._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar15 < iVar10) * iVar10 | (uint)(iVar15 >= iVar10) * iVar15;
  uVar75 = (uint)(iVar17 < iVar10) * iVar10 | (uint)(iVar17 >= iVar10) * iVar17;
  uVar77 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
  uVar79 = (uint)(iVar19 < iVar10) * iVar10 | (uint)(iVar19 >= iVar10) * iVar19;
  auVar93._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar93._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar93._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar93._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  auVar12 = pmulld(auVar69,auVar16);
  auVar94 = pmulld(auVar93,auVar57);
  auVar73._4_4_ = iVar47;
  auVar73._0_4_ = iVar47;
  auVar73._8_4_ = iVar47;
  auVar73._12_4_ = iVar47;
  auVar68 = pmulld((undefined1  [16])in[4],auVar73);
  auVar93 = pmulld(auVar93,auVar73);
  auVar70 = pmulld(auVar69,auVar57);
  auVar71._4_4_ = iVar7;
  auVar71._0_4_ = iVar7;
  auVar71._8_4_ = iVar7;
  auVar71._12_4_ = iVar7;
  uVar66 = (uint)(iVar80 < iVar10) * iVar10 | (uint)(iVar80 >= iVar10) * iVar80;
  uVar75 = (uint)(iVar85 < iVar10) * iVar10 | (uint)(iVar85 >= iVar10) * iVar85;
  uVar77 = (uint)(iVar87 < iVar10) * iVar10 | (uint)(iVar87 >= iVar10) * iVar87;
  uVar79 = (uint)(iVar89 < iVar10) * iVar10 | (uint)(iVar89 >= iVar10) * iVar89;
  auVar83._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar83._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar83._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar83._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar58 < iVar10) * iVar10 | (uint)(iVar58 >= iVar10) * iVar58;
  uVar75 = (uint)(iVar62 < iVar10) * iVar10 | (uint)(iVar62 >= iVar10) * iVar62;
  uVar77 = (uint)(iVar63 < iVar10) * iVar10 | (uint)(iVar63 >= iVar10) * iVar63;
  uVar79 = (uint)(iVar64 < iVar10) * iVar10 | (uint)(iVar64 >= iVar10) * iVar64;
  auVar60._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar60._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar60._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar60._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  auVar72 = pmulld(auVar71,auVar83);
  auVar34 = pmulld(auVar60,auVar16);
  auVar84 = pmulld(auVar83,auVar16);
  auVar16 = pmulld((undefined1  [16])in[4],auVar57);
  auVar61 = pmulld(auVar60,auVar57);
  uVar1 = *(undefined4 *)(&DAT_00d47500 + lVar6);
  auVar50._4_4_ = uVar1;
  auVar50._0_4_ = uVar1;
  auVar50._8_4_ = uVar1;
  auVar50._12_4_ = uVar1;
  auVar73 = pmulld((undefined1  [16])*in,auVar50);
  iVar80 = auVar73._0_4_ + iVar9 >> auVar21;
  iVar85 = auVar73._4_4_ + iVar9 >> auVar21;
  iVar87 = auVar73._8_4_ + iVar9 >> auVar21;
  iVar89 = auVar73._12_4_ + iVar9 >> auVar21;
  iVar11 = auVar68._0_4_ + iVar9 >> auVar21;
  iVar7 = auVar68._4_4_ + iVar9 >> auVar21;
  iVar17 = auVar68._8_4_ + iVar9 >> auVar21;
  iVar18 = auVar68._12_4_ + iVar9 >> auVar21;
  iVar47 = auVar16._0_4_ + iVar9 >> auVar21;
  iVar2 = auVar16._4_4_ + iVar9 >> auVar21;
  iVar8 = auVar16._8_4_ + iVar9 >> auVar21;
  iVar15 = auVar16._12_4_ + iVar9 >> auVar21;
  iVar97 = iVar80 - iVar11;
  iVar98 = iVar85 - iVar7;
  iVar109 = iVar87 - iVar17;
  iVar111 = iVar89 - iVar18;
  iVar11 = iVar11 + iVar80;
  iVar7 = iVar7 + iVar85;
  iVar17 = iVar17 + iVar87;
  iVar18 = iVar18 + iVar89;
  iVar37 = iVar47 + iVar80;
  iVar78 = iVar2 + iVar85;
  iVar91 = iVar8 + iVar87;
  iVar96 = iVar15 + iVar89;
  iVar80 = iVar80 - iVar47;
  iVar85 = iVar85 - iVar2;
  iVar87 = iVar87 - iVar8;
  iVar89 = iVar89 - iVar15;
  uVar66 = (uint)(iVar99 < iVar10) * iVar10 | (uint)(iVar99 >= iVar10) * iVar99;
  uVar75 = (uint)(iVar103 < iVar10) * iVar10 | (uint)(iVar103 >= iVar10) * iVar103;
  uVar77 = (uint)(iVar105 < iVar10) * iVar10 | (uint)(iVar105 >= iVar10) * iVar105;
  uVar79 = (uint)(iVar107 < iVar10) * iVar10 | (uint)(iVar107 >= iVar10) * iVar107;
  auVar102._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar102._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar102._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar102._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar113 < iVar10) * iVar10 | (uint)(iVar113 >= iVar10) * iVar113;
  uVar75 = (uint)(iVar116 < iVar10) * iVar10 | (uint)(iVar116 >= iVar10) * iVar116;
  uVar77 = (uint)(iVar117 < iVar10) * iVar10 | (uint)(iVar117 >= iVar10) * iVar117;
  uVar79 = (uint)(iVar118 < iVar10) * iVar10 | (uint)(iVar118 >= iVar10) * iVar118;
  auVar115._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar115._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar115._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar115._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  auVar16 = pmulld(auVar102,auVar50);
  auVar68 = pmulld(auVar115,auVar50);
  uVar66 = (uint)(iVar20 < iVar10) * iVar10 | (uint)(iVar20 >= iVar10) * iVar20;
  uVar75 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
  uVar77 = (uint)(iVar23 < iVar10) * iVar10 | (uint)(iVar23 >= iVar10) * iVar23;
  uVar79 = (uint)(iVar26 < iVar10) * iVar10 | (uint)(iVar26 >= iVar10) * iVar26;
  uVar48 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar52 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar54 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar56 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar46 < iVar10) * iVar10 | (uint)(iVar46 >= iVar10) * iVar46;
  uVar75 = (uint)(iVar53 < iVar10) * iVar10 | (uint)(iVar53 >= iVar10) * iVar53;
  uVar77 = (uint)(iVar24 < iVar10) * iVar10 | (uint)(iVar24 >= iVar10) * iVar24;
  uVar79 = (uint)(iVar27 < iVar10) * iVar10 | (uint)(iVar27 >= iVar10) * iVar27;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  iVar100 = uVar66 + uVar48;
  iVar104 = uVar75 + uVar52;
  iVar106 = uVar77 + uVar54;
  iVar108 = uVar79 + uVar56;
  iVar31 = uVar48 - uVar66;
  iVar58 = uVar52 - uVar75;
  iVar63 = uVar54 - uVar77;
  iVar65 = uVar56 - uVar79;
  iVar113 = auVar94._0_4_ + iVar9 + auVar12._0_4_ >> auVar21;
  iVar116 = auVar94._4_4_ + iVar9 + auVar12._4_4_ >> auVar21;
  iVar117 = auVar94._8_4_ + iVar9 + auVar12._8_4_ >> auVar21;
  iVar118 = auVar94._12_4_ + iVar9 + auVar12._12_4_ >> auVar21;
  iVar47 = auVar34._0_4_ + iVar9 + auVar72._0_4_ >> auVar21;
  iVar2 = auVar34._4_4_ + iVar9 + auVar72._4_4_ >> auVar21;
  iVar8 = auVar34._8_4_ + iVar9 + auVar72._8_4_ >> auVar21;
  iVar15 = auVar34._12_4_ + iVar9 + auVar72._12_4_ >> auVar21;
  iVar32 = iVar47 + iVar113;
  iVar62 = iVar2 + iVar116;
  iVar64 = iVar8 + iVar117;
  iVar74 = iVar15 + iVar118;
  iVar113 = iVar113 - iVar47;
  iVar116 = iVar116 - iVar2;
  iVar117 = iVar117 - iVar8;
  iVar118 = iVar118 - iVar15;
  uVar66 = (uint)(iVar51 < iVar10) * iVar10 | (uint)(iVar51 >= iVar10) * iVar51;
  uVar75 = (uint)(iVar55 < iVar10) * iVar10 | (uint)(iVar55 >= iVar10) * iVar55;
  uVar77 = (uint)(iVar25 < iVar10) * iVar10 | (uint)(iVar25 >= iVar10) * iVar25;
  uVar79 = (uint)(iVar28 < iVar10) * iVar10 | (uint)(iVar28 >= iVar10) * iVar28;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar48 = (uint)(iVar39 < iVar10) * iVar10 | (uint)(iVar39 >= iVar10) * iVar39;
  uVar52 = (uint)(iVar41 < iVar10) * iVar10 | (uint)(iVar41 >= iVar10) * iVar41;
  uVar54 = (uint)(iVar43 < iVar10) * iVar10 | (uint)(iVar43 >= iVar10) * iVar43;
  uVar56 = (uint)(iVar45 < iVar10) * iVar10 | (uint)(iVar45 >= iVar10) * iVar45;
  uVar48 = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  uVar52 = (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  uVar56 = (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  iVar36 = uVar66 + uVar48;
  iVar39 = uVar75 + uVar52;
  iVar43 = uVar77 + uVar54;
  iVar76 = uVar79 + uVar56;
  iVar27 = uVar48 - uVar66;
  iVar28 = uVar52 - uVar75;
  iVar29 = uVar54 - uVar77;
  iVar30 = uVar56 - uVar79;
  iVar51 = auVar93._0_4_ + iVar9 + auVar70._0_4_ >> auVar21;
  iVar22 = auVar93._4_4_ + iVar9 + auVar70._4_4_ >> auVar21;
  iVar53 = auVar93._8_4_ + iVar9 + auVar70._8_4_ >> auVar21;
  iVar55 = auVar93._12_4_ + iVar9 + auVar70._12_4_ >> auVar21;
  iVar19 = auVar61._0_4_ + iVar9 + auVar84._0_4_ >> auVar21;
  iVar20 = auVar61._4_4_ + iVar9 + auVar84._4_4_ >> auVar21;
  iVar46 = auVar61._8_4_ + iVar9 + auVar84._8_4_ >> auVar21;
  iVar23 = auVar61._12_4_ + iVar9 + auVar84._12_4_ >> auVar21;
  iVar47 = iVar19 + iVar51;
  iVar2 = iVar20 + iVar22;
  iVar8 = iVar46 + iVar53;
  iVar15 = iVar23 + iVar55;
  iVar51 = iVar51 - iVar19;
  iVar22 = iVar22 - iVar20;
  iVar53 = iVar53 - iVar46;
  iVar55 = iVar55 - iVar23;
  uVar66 = (uint)(iVar13 < iVar10) * iVar10 | (uint)(iVar13 >= iVar10) * iVar13;
  uVar75 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
  uVar77 = (uint)(iVar33 < iVar10) * iVar10 | (uint)(iVar33 >= iVar10) * iVar33;
  uVar79 = (uint)(iVar35 < iVar10) * iVar10 | (uint)(iVar35 >= iVar10) * iVar35;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar48 = (uint)(iVar11 < iVar10) * iVar10 | (uint)(iVar11 >= iVar10) * iVar11;
  uVar52 = (uint)(iVar7 < iVar10) * iVar10 | (uint)(iVar7 >= iVar10) * iVar7;
  uVar54 = (uint)(iVar17 < iVar10) * iVar10 | (uint)(iVar17 >= iVar10) * iVar17;
  uVar56 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
  uVar48 = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  uVar52 = (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  uVar56 = (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  iVar23 = uVar48 + uVar66;
  iVar24 = uVar52 + uVar75;
  iVar25 = uVar54 + uVar77;
  iVar26 = uVar56 + uVar79;
  iVar18 = uVar48 - uVar66;
  iVar19 = uVar52 - uVar75;
  iVar20 = uVar54 - uVar77;
  iVar46 = uVar56 - uVar79;
  uVar66 = (uint)(iVar37 < iVar10) * iVar10 | (uint)(iVar37 >= iVar10) * iVar37;
  uVar75 = (uint)(iVar78 < iVar10) * iVar10 | (uint)(iVar78 >= iVar10) * iVar78;
  uVar77 = (uint)(iVar91 < iVar10) * iVar10 | (uint)(iVar91 >= iVar10) * iVar91;
  uVar79 = (uint)(iVar96 < iVar10) * iVar10 | (uint)(iVar96 >= iVar10) * iVar96;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  iVar99 = auVar68._0_4_ + iVar9 + auVar16._0_4_ >> auVar21;
  iVar103 = auVar68._4_4_ + iVar9 + auVar16._4_4_ >> auVar21;
  iVar105 = auVar68._8_4_ + iVar9 + auVar16._8_4_ >> auVar21;
  iVar107 = auVar68._12_4_ + iVar9 + auVar16._12_4_ >> auVar21;
  iVar37 = iVar99 + uVar66;
  iVar41 = iVar103 + uVar75;
  iVar45 = iVar105 + uVar77;
  iVar78 = iVar107 + uVar79;
  iVar99 = uVar66 - iVar99;
  iVar103 = uVar75 - iVar103;
  iVar105 = uVar77 - iVar105;
  iVar107 = uVar79 - iVar107;
  uVar66 = (uint)(iVar80 < iVar10) * iVar10 | (uint)(iVar80 >= iVar10) * iVar80;
  uVar75 = (uint)(iVar85 < iVar10) * iVar10 | (uint)(iVar85 >= iVar10) * iVar85;
  uVar77 = (uint)(iVar87 < iVar10) * iVar10 | (uint)(iVar87 >= iVar10) * iVar87;
  uVar79 = (uint)(iVar89 < iVar10) * iVar10 | (uint)(iVar89 >= iVar10) * iVar89;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  iVar80 = (iVar9 - auVar16._0_4_) + auVar68._0_4_ >> auVar21;
  iVar85 = (iVar9 - auVar16._4_4_) + auVar68._4_4_ >> auVar21;
  iVar87 = (iVar9 - auVar16._8_4_) + auVar68._8_4_ >> auVar21;
  iVar89 = (iVar9 - auVar16._12_4_) + auVar68._12_4_ >> auVar21;
  iVar11 = iVar80 + uVar66;
  iVar14 = iVar85 + uVar75;
  iVar33 = iVar87 + uVar77;
  iVar17 = iVar89 + uVar79;
  iVar80 = uVar66 - iVar80;
  iVar85 = uVar75 - iVar85;
  iVar87 = uVar77 - iVar87;
  iVar89 = uVar79 - iVar89;
  uVar66 = (uint)(iVar38 < iVar10) * iVar10 | (uint)(iVar38 >= iVar10) * iVar38;
  uVar75 = (uint)(iVar40 < iVar10) * iVar10 | (uint)(iVar40 >= iVar10) * iVar40;
  uVar77 = (uint)(iVar42 < iVar10) * iVar10 | (uint)(iVar42 >= iVar10) * iVar42;
  uVar79 = (uint)(iVar44 < iVar10) * iVar10 | (uint)(iVar44 >= iVar10) * iVar44;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar48 = (uint)(iVar97 < iVar10) * iVar10 | (uint)(iVar97 >= iVar10) * iVar97;
  uVar52 = (uint)(iVar98 < iVar10) * iVar10 | (uint)(iVar98 >= iVar10) * iVar98;
  uVar54 = (uint)(iVar109 < iVar10) * iVar10 | (uint)(iVar109 >= iVar10) * iVar109;
  uVar56 = (uint)(iVar111 < iVar10) * iVar10 | (uint)(iVar111 >= iVar10) * iVar111;
  uVar48 = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  uVar52 = (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  uVar56 = (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  iVar91 = uVar48 + uVar66;
  iVar96 = uVar52 + uVar75;
  iVar97 = uVar54 + uVar77;
  iVar98 = uVar56 + uVar79;
  iVar109 = uVar48 - uVar66;
  iVar111 = uVar52 - uVar75;
  iVar110 = uVar54 - uVar77;
  iVar112 = uVar56 - uVar79;
  uVar66 = (uint)(iVar113 < iVar10) * iVar10 | (uint)(iVar113 >= iVar10) * iVar113;
  uVar75 = (uint)(iVar116 < iVar10) * iVar10 | (uint)(iVar116 >= iVar10) * iVar116;
  uVar77 = (uint)(iVar117 < iVar10) * iVar10 | (uint)(iVar117 >= iVar10) * iVar117;
  uVar79 = (uint)(iVar118 < iVar10) * iVar10 | (uint)(iVar118 >= iVar10) * iVar118;
  auVar95._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar95._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar95._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar95._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar51 < iVar10) * iVar10 | (uint)(iVar51 >= iVar10) * iVar51;
  uVar75 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
  uVar77 = (uint)(iVar53 < iVar10) * iVar10 | (uint)(iVar53 >= iVar10) * iVar53;
  uVar79 = (uint)(iVar55 < iVar10) * iVar10 | (uint)(iVar55 >= iVar10) * iVar55;
  auVar34._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar34._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar34._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar34._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  auVar68 = pmulld(auVar95,auVar50);
  auVar16 = pmulld(auVar34,auVar50);
  uVar66 = (uint)(iVar31 < iVar10) * iVar10 | (uint)(iVar31 >= iVar10) * iVar31;
  uVar75 = (uint)(iVar58 < iVar10) * iVar10 | (uint)(iVar58 >= iVar10) * iVar58;
  uVar77 = (uint)(iVar63 < iVar10) * iVar10 | (uint)(iVar63 >= iVar10) * iVar63;
  uVar79 = (uint)(iVar65 < iVar10) * iVar10 | (uint)(iVar65 >= iVar10) * iVar65;
  auVar61._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar61._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar61._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar61._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar27 < iVar10) * iVar10 | (uint)(iVar27 >= iVar10) * iVar27;
  uVar75 = (uint)(iVar28 < iVar10) * iVar10 | (uint)(iVar28 >= iVar10) * iVar28;
  uVar77 = (uint)(iVar29 < iVar10) * iVar10 | (uint)(iVar29 >= iVar10) * iVar29;
  uVar79 = (uint)(iVar30 < iVar10) * iVar10 | (uint)(iVar30 >= iVar10) * iVar30;
  auVar94._0_4_ = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  auVar94._4_4_ = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  auVar94._8_4_ = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  auVar94._12_4_ = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  auVar12 = pmulld(auVar61,auVar50);
  auVar50 = pmulld(auVar94,auVar50);
  iVar31 = (iVar9 - auVar68._0_4_) + auVar16._0_4_ >> auVar21;
  iVar58 = (iVar9 - auVar68._4_4_) + auVar16._4_4_ >> auVar21;
  iVar63 = (iVar9 - auVar68._8_4_) + auVar16._8_4_ >> auVar21;
  iVar65 = (iVar9 - auVar68._12_4_) + auVar16._12_4_ >> auVar21;
  iVar13 = auVar68._0_4_ + iVar9 + auVar16._0_4_ >> auVar21;
  iVar7 = auVar68._4_4_ + iVar9 + auVar16._4_4_ >> auVar21;
  iVar35 = auVar68._8_4_ + iVar9 + auVar16._8_4_ >> auVar21;
  iVar38 = auVar68._12_4_ + iVar9 + auVar16._12_4_ >> auVar21;
  iVar27 = (iVar9 - auVar12._0_4_) + auVar50._0_4_ >> auVar21;
  iVar28 = (iVar9 - auVar12._4_4_) + auVar50._4_4_ >> auVar21;
  iVar29 = (iVar9 - auVar12._8_4_) + auVar50._8_4_ >> auVar21;
  iVar30 = (iVar9 - auVar12._12_4_) + auVar50._12_4_ >> auVar21;
  iVar51 = auVar50._0_4_ + iVar9 + auVar12._0_4_ >> auVar21;
  iVar22 = auVar50._4_4_ + iVar9 + auVar12._4_4_ >> auVar21;
  iVar53 = auVar50._8_4_ + iVar9 + auVar12._8_4_ >> auVar21;
  iVar55 = auVar50._12_4_ + iVar9 + auVar12._12_4_ >> auVar21;
  uVar66 = (uint)(iVar36 < iVar10) * iVar10 | (uint)(iVar36 >= iVar10) * iVar36;
  uVar75 = (uint)(iVar39 < iVar10) * iVar10 | (uint)(iVar39 >= iVar10) * iVar39;
  uVar77 = (uint)(iVar43 < iVar10) * iVar10 | (uint)(iVar43 >= iVar10) * iVar43;
  uVar79 = (uint)(iVar76 < iVar10) * iVar10 | (uint)(iVar76 >= iVar10) * iVar76;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar48 = (uint)(iVar23 < iVar10) * iVar10 | (uint)(iVar23 >= iVar10) * iVar23;
  uVar52 = (uint)(iVar24 < iVar10) * iVar10 | (uint)(iVar24 >= iVar10) * iVar24;
  uVar54 = (uint)(iVar25 < iVar10) * iVar10 | (uint)(iVar25 >= iVar10) * iVar25;
  uVar56 = (uint)(iVar26 < iVar10) * iVar10 | (uint)(iVar26 >= iVar10) * iVar26;
  uVar48 = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  uVar52 = (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  uVar56 = (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  iVar23 = uVar48 + uVar66;
  iVar24 = uVar52 + uVar75;
  iVar25 = uVar54 + uVar77;
  iVar26 = uVar56 + uVar79;
  iVar9 = uVar48 - uVar66;
  iVar40 = uVar52 - uVar75;
  iVar42 = uVar54 - uVar77;
  iVar44 = uVar56 - uVar79;
  uVar66 = (uint)(iVar23 < iVar10) * iVar10 | (uint)(iVar23 >= iVar10) * iVar23;
  uVar75 = (uint)(iVar24 < iVar10) * iVar10 | (uint)(iVar24 >= iVar10) * iVar24;
  uVar77 = (uint)(iVar25 < iVar10) * iVar10 | (uint)(iVar25 >= iVar10) * iVar25;
  uVar79 = (uint)(iVar26 < iVar10) * iVar10 | (uint)(iVar26 >= iVar10) * iVar26;
  *(uint *)*out = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)*out + 4) = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(*out + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar9 < iVar10) * iVar10 | (uint)(iVar9 >= iVar10) * iVar9;
  uVar75 = (uint)(iVar40 < iVar10) * iVar10 | (uint)(iVar40 >= iVar10) * iVar40;
  uVar77 = (uint)(iVar42 < iVar10) * iVar10 | (uint)(iVar42 >= iVar10) * iVar42;
  uVar79 = (uint)(iVar44 < iVar10) * iVar10 | (uint)(iVar44 >= iVar10) * iVar44;
  *(uint *)out[0xf] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[0xf] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[0xf] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[0xf] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar47 < iVar10) * iVar10 | (uint)(iVar47 >= iVar10) * iVar47;
  uVar75 = (uint)(iVar2 < iVar10) * iVar10 | (uint)(iVar2 >= iVar10) * iVar2;
  uVar77 = (uint)(iVar8 < iVar10) * iVar10 | (uint)(iVar8 >= iVar10) * iVar8;
  uVar79 = (uint)(iVar15 < iVar10) * iVar10 | (uint)(iVar15 >= iVar10) * iVar15;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar48 = (uint)(iVar37 < iVar10) * iVar10 | (uint)(iVar37 >= iVar10) * iVar37;
  uVar52 = (uint)(iVar41 < iVar10) * iVar10 | (uint)(iVar41 >= iVar10) * iVar41;
  uVar54 = (uint)(iVar45 < iVar10) * iVar10 | (uint)(iVar45 >= iVar10) * iVar45;
  uVar56 = (uint)(iVar78 < iVar10) * iVar10 | (uint)(iVar78 >= iVar10) * iVar78;
  uVar48 = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  uVar52 = (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  uVar56 = (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  iVar47 = uVar48 + uVar66;
  iVar2 = uVar52 + uVar75;
  iVar8 = uVar54 + uVar77;
  iVar9 = uVar56 + uVar79;
  iVar15 = uVar48 - uVar66;
  iVar40 = uVar52 - uVar75;
  iVar42 = uVar54 - uVar77;
  iVar44 = uVar56 - uVar79;
  uVar66 = (uint)(iVar47 < iVar10) * iVar10 | (uint)(iVar47 >= iVar10) * iVar47;
  uVar75 = (uint)(iVar2 < iVar10) * iVar10 | (uint)(iVar2 >= iVar10) * iVar2;
  uVar77 = (uint)(iVar8 < iVar10) * iVar10 | (uint)(iVar8 >= iVar10) * iVar8;
  uVar79 = (uint)(iVar9 < iVar10) * iVar10 | (uint)(iVar9 >= iVar10) * iVar9;
  *(uint *)out[1] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[1] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar11 < iVar10) * iVar10 | (uint)(iVar11 >= iVar10) * iVar11;
  uVar75 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
  uVar77 = (uint)(iVar33 < iVar10) * iVar10 | (uint)(iVar33 >= iVar10) * iVar33;
  uVar79 = (uint)(iVar17 < iVar10) * iVar10 | (uint)(iVar17 >= iVar10) * iVar17;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar48 = (uint)(iVar15 < iVar10) * iVar10 | (uint)(iVar15 >= iVar10) * iVar15;
  uVar52 = (uint)(iVar40 < iVar10) * iVar10 | (uint)(iVar40 >= iVar10) * iVar40;
  uVar54 = (uint)(iVar42 < iVar10) * iVar10 | (uint)(iVar42 >= iVar10) * iVar42;
  uVar56 = (uint)(iVar44 < iVar10) * iVar10 | (uint)(iVar44 >= iVar10) * iVar44;
  *(uint *)out[0xe] = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  *(uint *)((long)out[0xe] + 4) =
       (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  *(uint *)(out[0xe] + 1) = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  *(uint *)((long)out[0xe] + 0xc) =
       (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  iVar47 = iVar13 + uVar66;
  iVar11 = iVar7 + uVar75;
  iVar14 = iVar35 + uVar77;
  iVar2 = iVar38 + uVar79;
  iVar13 = uVar66 - iVar13;
  iVar7 = uVar75 - iVar7;
  iVar35 = uVar77 - iVar35;
  iVar38 = uVar79 - iVar38;
  uVar66 = (uint)(iVar47 < iVar10) * iVar10 | (uint)(iVar47 >= iVar10) * iVar47;
  uVar75 = (uint)(iVar11 < iVar10) * iVar10 | (uint)(iVar11 >= iVar10) * iVar11;
  uVar77 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
  uVar79 = (uint)(iVar2 < iVar10) * iVar10 | (uint)(iVar2 >= iVar10) * iVar2;
  *(uint *)out[2] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[2] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar91 < iVar10) * iVar10 | (uint)(iVar91 >= iVar10) * iVar91;
  uVar75 = (uint)(iVar96 < iVar10) * iVar10 | (uint)(iVar96 >= iVar10) * iVar96;
  uVar77 = (uint)(iVar97 < iVar10) * iVar10 | (uint)(iVar97 >= iVar10) * iVar97;
  uVar79 = (uint)(iVar98 < iVar10) * iVar10 | (uint)(iVar98 >= iVar10) * iVar98;
  uVar48 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar52 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar54 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar56 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar13 < iVar10) * iVar10 | (uint)(iVar13 >= iVar10) * iVar13;
  uVar75 = (uint)(iVar7 < iVar10) * iVar10 | (uint)(iVar7 >= iVar10) * iVar7;
  uVar77 = (uint)(iVar35 < iVar10) * iVar10 | (uint)(iVar35 >= iVar10) * iVar35;
  uVar79 = (uint)(iVar38 < iVar10) * iVar10 | (uint)(iVar38 >= iVar10) * iVar38;
  *(uint *)out[0xd] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[0xd] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[0xd] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[0xd] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  iVar47 = iVar51 + uVar48;
  iVar11 = iVar22 + uVar52;
  iVar13 = iVar53 + uVar54;
  iVar14 = iVar55 + uVar56;
  iVar51 = uVar48 - iVar51;
  iVar22 = uVar52 - iVar22;
  iVar53 = uVar54 - iVar53;
  iVar55 = uVar56 - iVar55;
  uVar66 = (uint)(iVar47 < iVar10) * iVar10 | (uint)(iVar47 >= iVar10) * iVar47;
  uVar75 = (uint)(iVar11 < iVar10) * iVar10 | (uint)(iVar11 >= iVar10) * iVar11;
  uVar77 = (uint)(iVar13 < iVar10) * iVar10 | (uint)(iVar13 >= iVar10) * iVar13;
  uVar79 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
  *(uint *)out[3] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[3] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar109 < iVar10) * iVar10 | (uint)(iVar109 >= iVar10) * iVar109;
  uVar75 = (uint)(iVar111 < iVar10) * iVar10 | (uint)(iVar111 >= iVar10) * iVar111;
  uVar77 = (uint)(iVar110 < iVar10) * iVar10 | (uint)(iVar110 >= iVar10) * iVar110;
  uVar79 = (uint)(iVar112 < iVar10) * iVar10 | (uint)(iVar112 >= iVar10) * iVar112;
  uVar48 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar52 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar54 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar56 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar51 < iVar10) * iVar10 | (uint)(iVar51 >= iVar10) * iVar51;
  uVar75 = (uint)(iVar22 < iVar10) * iVar10 | (uint)(iVar22 >= iVar10) * iVar22;
  uVar77 = (uint)(iVar53 < iVar10) * iVar10 | (uint)(iVar53 >= iVar10) * iVar53;
  uVar79 = (uint)(iVar55 < iVar10) * iVar10 | (uint)(iVar55 >= iVar10) * iVar55;
  *(uint *)out[0xc] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[0xc] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[0xc] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[0xc] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  iVar47 = iVar27 + uVar48;
  iVar11 = iVar28 + uVar52;
  iVar13 = iVar29 + uVar54;
  iVar14 = iVar30 + uVar56;
  iVar27 = uVar48 - iVar27;
  iVar28 = uVar52 - iVar28;
  iVar29 = uVar54 - iVar29;
  iVar30 = uVar56 - iVar30;
  uVar66 = (uint)(iVar47 < iVar10) * iVar10 | (uint)(iVar47 >= iVar10) * iVar47;
  uVar75 = (uint)(iVar11 < iVar10) * iVar10 | (uint)(iVar11 >= iVar10) * iVar11;
  uVar77 = (uint)(iVar13 < iVar10) * iVar10 | (uint)(iVar13 >= iVar10) * iVar13;
  uVar79 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
  *(uint *)out[4] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[4] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar80 < iVar10) * iVar10 | (uint)(iVar80 >= iVar10) * iVar80;
  uVar75 = (uint)(iVar85 < iVar10) * iVar10 | (uint)(iVar85 >= iVar10) * iVar85;
  uVar77 = (uint)(iVar87 < iVar10) * iVar10 | (uint)(iVar87 >= iVar10) * iVar87;
  uVar79 = (uint)(iVar89 < iVar10) * iVar10 | (uint)(iVar89 >= iVar10) * iVar89;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar48 = (uint)(iVar27 < iVar10) * iVar10 | (uint)(iVar27 >= iVar10) * iVar27;
  uVar52 = (uint)(iVar28 < iVar10) * iVar10 | (uint)(iVar28 >= iVar10) * iVar28;
  uVar54 = (uint)(iVar29 < iVar10) * iVar10 | (uint)(iVar29 >= iVar10) * iVar29;
  uVar56 = (uint)(iVar30 < iVar10) * iVar10 | (uint)(iVar30 >= iVar10) * iVar30;
  *(uint *)out[0xb] = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  *(uint *)((long)out[0xb] + 4) =
       (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  *(uint *)(out[0xb] + 1) = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  *(uint *)((long)out[0xb] + 0xc) =
       (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  iVar47 = uVar66 + iVar31;
  iVar11 = uVar75 + iVar58;
  iVar13 = uVar77 + iVar63;
  iVar14 = uVar79 + iVar65;
  iVar31 = uVar66 - iVar31;
  iVar58 = uVar75 - iVar58;
  iVar63 = uVar77 - iVar63;
  iVar65 = uVar79 - iVar65;
  uVar66 = (uint)(iVar47 < iVar10) * iVar10 | (uint)(iVar47 >= iVar10) * iVar47;
  uVar75 = (uint)(iVar11 < iVar10) * iVar10 | (uint)(iVar11 >= iVar10) * iVar11;
  uVar77 = (uint)(iVar13 < iVar10) * iVar10 | (uint)(iVar13 >= iVar10) * iVar13;
  uVar79 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
  *(uint *)out[5] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[5] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar32 < iVar10) * iVar10 | (uint)(iVar32 >= iVar10) * iVar32;
  uVar75 = (uint)(iVar62 < iVar10) * iVar10 | (uint)(iVar62 >= iVar10) * iVar62;
  uVar77 = (uint)(iVar64 < iVar10) * iVar10 | (uint)(iVar64 >= iVar10) * iVar64;
  uVar79 = (uint)(iVar74 < iVar10) * iVar10 | (uint)(iVar74 >= iVar10) * iVar74;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar48 = (uint)(iVar99 < iVar10) * iVar10 | (uint)(iVar99 >= iVar10) * iVar99;
  uVar52 = (uint)(iVar103 < iVar10) * iVar10 | (uint)(iVar103 >= iVar10) * iVar103;
  uVar54 = (uint)(iVar105 < iVar10) * iVar10 | (uint)(iVar105 >= iVar10) * iVar105;
  uVar56 = (uint)(iVar107 < iVar10) * iVar10 | (uint)(iVar107 >= iVar10) * iVar107;
  uVar81 = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  uVar86 = (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  uVar88 = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  uVar90 = (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  uVar48 = (uint)(iVar31 < iVar10) * iVar10 | (uint)(iVar31 >= iVar10) * iVar31;
  uVar52 = (uint)(iVar58 < iVar10) * iVar10 | (uint)(iVar58 >= iVar10) * iVar58;
  uVar54 = (uint)(iVar63 < iVar10) * iVar10 | (uint)(iVar63 >= iVar10) * iVar63;
  uVar56 = (uint)(iVar65 < iVar10) * iVar10 | (uint)(iVar65 >= iVar10) * iVar65;
  *(uint *)out[10] = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  *(uint *)((long)out[10] + 4) =
       (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  *(uint *)(out[10] + 1) = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  *(uint *)((long)out[10] + 0xc) =
       (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  iVar47 = uVar81 + uVar66;
  iVar11 = uVar86 + uVar75;
  iVar13 = uVar88 + uVar77;
  iVar14 = uVar90 + uVar79;
  iVar2 = uVar81 - uVar66;
  iVar7 = uVar86 - uVar75;
  iVar8 = uVar88 - uVar77;
  iVar9 = uVar90 - uVar79;
  uVar66 = (uint)(iVar47 < iVar10) * iVar10 | (uint)(iVar47 >= iVar10) * iVar47;
  uVar75 = (uint)(iVar11 < iVar10) * iVar10 | (uint)(iVar11 >= iVar10) * iVar11;
  uVar77 = (uint)(iVar13 < iVar10) * iVar10 | (uint)(iVar13 >= iVar10) * iVar13;
  uVar79 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
  *(uint *)out[6] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[6] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar100 < iVar10) * iVar10 | (uint)(iVar100 >= iVar10) * iVar100;
  uVar75 = (uint)(iVar104 < iVar10) * iVar10 | (uint)(iVar104 >= iVar10) * iVar104;
  uVar77 = (uint)(iVar106 < iVar10) * iVar10 | (uint)(iVar106 >= iVar10) * iVar106;
  uVar79 = (uint)(iVar108 < iVar10) * iVar10 | (uint)(iVar108 >= iVar10) * iVar108;
  uVar48 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar52 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar54 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar56 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar66 = (uint)(iVar18 < iVar10) * iVar10 | (uint)(iVar18 >= iVar10) * iVar18;
  uVar75 = (uint)(iVar19 < iVar10) * iVar10 | (uint)(iVar19 >= iVar10) * iVar19;
  uVar77 = (uint)(iVar20 < iVar10) * iVar10 | (uint)(iVar20 >= iVar10) * iVar20;
  uVar79 = (uint)(iVar46 < iVar10) * iVar10 | (uint)(iVar46 >= iVar10) * iVar46;
  uVar66 = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  uVar75 = (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  uVar77 = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  uVar79 = (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  uVar81 = (uint)(iVar2 < iVar10) * iVar10 | (uint)(iVar2 >= iVar10) * iVar2;
  uVar86 = (uint)(iVar7 < iVar10) * iVar10 | (uint)(iVar7 >= iVar10) * iVar7;
  uVar88 = (uint)(iVar8 < iVar10) * iVar10 | (uint)(iVar8 >= iVar10) * iVar8;
  uVar90 = (uint)(iVar9 < iVar10) * iVar10 | (uint)(iVar9 >= iVar10) * iVar9;
  *(uint *)out[9] = (uint)(iVar4 < (int)uVar81) * iVar4 | (iVar4 >= (int)uVar81) * uVar81;
  *(uint *)((long)out[9] + 4) =
       (uint)(iVar4 < (int)uVar86) * iVar4 | (iVar4 >= (int)uVar86) * uVar86;
  *(uint *)(out[9] + 1) = (uint)(iVar4 < (int)uVar88) * iVar4 | (iVar4 >= (int)uVar88) * uVar88;
  *(uint *)((long)out[9] + 0xc) =
       (uint)(iVar4 < (int)uVar90) * iVar4 | (iVar4 >= (int)uVar90) * uVar90;
  iVar47 = uVar66 + uVar48;
  iVar11 = uVar75 + uVar52;
  iVar13 = uVar77 + uVar54;
  iVar14 = uVar79 + uVar56;
  iVar2 = uVar66 - uVar48;
  iVar7 = uVar75 - uVar52;
  iVar8 = uVar77 - uVar54;
  iVar9 = uVar79 - uVar56;
  uVar66 = (uint)(iVar47 < iVar10) * iVar10 | (uint)(iVar47 >= iVar10) * iVar47;
  uVar75 = (uint)(iVar11 < iVar10) * iVar10 | (uint)(iVar11 >= iVar10) * iVar11;
  uVar77 = (uint)(iVar13 < iVar10) * iVar10 | (uint)(iVar13 >= iVar10) * iVar13;
  uVar79 = (uint)(iVar14 < iVar10) * iVar10 | (uint)(iVar14 >= iVar10) * iVar14;
  uVar48 = (uint)(iVar2 < iVar10) * iVar10 | (uint)(iVar2 >= iVar10) * iVar2;
  uVar52 = (uint)(iVar7 < iVar10) * iVar10 | (uint)(iVar7 >= iVar10) * iVar7;
  uVar54 = (uint)(iVar8 < iVar10) * iVar10 | (uint)(iVar8 >= iVar10) * iVar8;
  uVar56 = (uint)(iVar9 < iVar10) * iVar10 | (uint)(iVar9 >= iVar10) * iVar9;
  *(uint *)out[7] = (uint)(iVar4 < (int)uVar66) * iVar4 | (iVar4 >= (int)uVar66) * uVar66;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar4 < (int)uVar75) * iVar4 | (iVar4 >= (int)uVar75) * uVar75;
  *(uint *)(out[7] + 1) = (uint)(iVar4 < (int)uVar77) * iVar4 | (iVar4 >= (int)uVar77) * uVar77;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar4 < (int)uVar79) * iVar4 | (iVar4 >= (int)uVar79) * uVar79;
  *(uint *)out[8] = (uint)(iVar4 < (int)uVar48) * iVar4 | (iVar4 >= (int)uVar48) * uVar48;
  *(uint *)((long)out[8] + 4) =
       (uint)(iVar4 < (int)uVar52) * iVar4 | (iVar4 >= (int)uVar52) * uVar52;
  *(uint *)(out[8] + 1) = (uint)(iVar4 < (int)uVar54) * iVar4 | (iVar4 >= (int)uVar54) * uVar54;
  *(uint *)((long)out[8] + 0xc) =
       (uint)(iVar4 < (int)uVar56) * iVar4 | (iVar4 >= (int)uVar56) * uVar56;
  if (do_cols == 0) {
    bVar3 = 10;
    if (10 < bd) {
      bVar3 = (byte)bd;
    }
    local_58 = 0x20 << (bVar3 & 0x1f);
    local_48 = -local_58;
    local_58 = local_58 + -1;
    iStack_54 = local_58;
    iStack_50 = local_58;
    iStack_4c = local_58;
    iStack_44 = local_48;
    iStack_40 = local_48;
    iStack_3c = local_48;
    round_shift_8x8(out,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,(__m128i *)&local_48,(__m128i *)&local_58,0x10);
  }
  return;
}

Assistant:

static void idct16x16_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                  int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi60 = _mm_set1_epi32(cospi[60]);
  const __m128i cospi28 = _mm_set1_epi32(cospi[28]);
  const __m128i cospi44 = _mm_set1_epi32(cospi[44]);
  const __m128i cospi20 = _mm_set1_epi32(cospi[20]);
  const __m128i cospi12 = _mm_set1_epi32(cospi[12]);
  const __m128i cospi4 = _mm_set1_epi32(cospi[4]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospim36 = _mm_set1_epi32(-cospi[36]);
  const __m128i cospim52 = _mm_set1_epi32(-cospi[52]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u[16], x, y;
  // stage 0
  // stage 1
  u[0] = in[0];
  u[2] = in[4];
  u[4] = in[2];
  u[6] = in[6];
  u[8] = in[1];
  u[10] = in[5];
  u[12] = in[3];
  u[14] = in[7];

  // stage 2
  u[15] = half_btf_0_sse4_1(&cospi4, &u[8], &rnding, bit);
  u[8] = half_btf_0_sse4_1(&cospi60, &u[8], &rnding, bit);

  u[9] = half_btf_0_sse4_1(&cospim36, &u[14], &rnding, bit);
  u[14] = half_btf_0_sse4_1(&cospi28, &u[14], &rnding, bit);

  u[13] = half_btf_0_sse4_1(&cospi20, &u[10], &rnding, bit);
  u[10] = half_btf_0_sse4_1(&cospi44, &u[10], &rnding, bit);

  u[11] = half_btf_0_sse4_1(&cospim52, &u[12], &rnding, bit);
  u[12] = half_btf_0_sse4_1(&cospi12, &u[12], &rnding, bit);

  // stage 3
  u[7] = half_btf_0_sse4_1(&cospi8, &u[4], &rnding, bit);
  u[4] = half_btf_0_sse4_1(&cospi56, &u[4], &rnding, bit);
  u[5] = half_btf_0_sse4_1(&cospim40, &u[6], &rnding, bit);
  u[6] = half_btf_0_sse4_1(&cospi24, &u[6], &rnding, bit);

  addsub_sse4_1(u[8], u[9], &u[8], &u[9], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[11], u[10], &u[11], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[12], u[13], &u[12], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[15], u[14], &u[15], &u[14], &clamp_lo, &clamp_hi);

  // stage 4
  x = _mm_mullo_epi32(u[0], cospi32);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);
  u[1] = u[0];

  u[3] = half_btf_0_sse4_1(&cospi16, &u[2], &rnding, bit);
  u[2] = half_btf_0_sse4_1(&cospi48, &u[2], &rnding, bit);

  addsub_sse4_1(u[4], u[5], &u[4], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[6], &u[7], &u[6], &clamp_lo, &clamp_hi);

  x = half_btf_sse4_1(&cospim16, &u[9], &cospi48, &u[14], &rnding, bit);
  u[14] = half_btf_sse4_1(&cospi48, &u[9], &cospi16, &u[14], &rnding, bit);
  u[9] = x;
  y = half_btf_sse4_1(&cospim48, &u[10], &cospim16, &u[13], &rnding, bit);
  u[13] = half_btf_sse4_1(&cospim16, &u[10], &cospi48, &u[13], &rnding, bit);
  u[10] = y;

  // stage 5
  addsub_sse4_1(u[0], u[3], &u[0], &u[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[2], &u[1], &u[2], &clamp_lo, &clamp_hi);

  x = _mm_mullo_epi32(u[5], cospi32);
  y = _mm_mullo_epi32(u[6], cospi32);
  u[5] = _mm_sub_epi32(y, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  u[6] = _mm_add_epi32(y, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  addsub_sse4_1(u[8], u[11], &u[8], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[10], &u[9], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[15], u[12], &u[15], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[14], u[13], &u[14], &u[13], &clamp_lo, &clamp_hi);

  // stage 6
  addsub_sse4_1(u[0], u[7], &u[0], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[6], &u[1], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[5], &u[2], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[4], &u[3], &u[4], &clamp_lo, &clamp_hi);

  x = _mm_mullo_epi32(u[10], cospi32);
  y = _mm_mullo_epi32(u[13], cospi32);
  u[10] = _mm_sub_epi32(y, x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[13] = _mm_add_epi32(x, y);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[11], cospi32);
  y = _mm_mullo_epi32(u[12], cospi32);
  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  u[12] = _mm_add_epi32(x, y);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);
  // stage 7
  addsub_sse4_1(u[0], u[15], out + 0, out + 15, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[14], out + 1, out + 14, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[13], out + 2, out + 13, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[12], out + 3, out + 12, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[11], out + 4, out + 11, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[10], out + 5, out + 10, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[6], u[9], out + 6, out + 9, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[8], out + 7, out + 8, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);
    round_shift_8x8(out, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 16);
  }
}